

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatClause.c
# Opt level: O0

void Msat_ClauseRemoveWatch(Msat_ClauseVec_t *vClauses,Msat_Clause_t *pC)

{
  int iVar1;
  Msat_Clause_t **ppMVar2;
  int local_28;
  int i;
  int nClauses;
  Msat_Clause_t **pClauses;
  Msat_Clause_t *pC_local;
  Msat_ClauseVec_t *vClauses_local;
  
  iVar1 = Msat_ClauseVecReadSize(vClauses);
  ppMVar2 = Msat_ClauseVecReadArray(vClauses);
  local_28 = 0;
  while( true ) {
    if (ppMVar2[local_28] == pC) {
      for (; local_28 < iVar1 + -1; local_28 = local_28 + 1) {
        ppMVar2[local_28] = ppMVar2[local_28 + 1];
      }
      Msat_ClauseVecPop(vClauses);
      return;
    }
    if (iVar1 <= local_28) break;
    local_28 = local_28 + 1;
  }
  __assert_fail("i < nClauses",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/msat/msatClause.c"
                ,0x1c3,"void Msat_ClauseRemoveWatch(Msat_ClauseVec_t *, Msat_Clause_t *)");
}

Assistant:

void Msat_ClauseRemoveWatch( Msat_ClauseVec_t * vClauses, Msat_Clause_t * pC )
{
    Msat_Clause_t ** pClauses;
    int nClauses, i;
    nClauses = Msat_ClauseVecReadSize( vClauses );
    pClauses = Msat_ClauseVecReadArray( vClauses );
    for ( i = 0; pClauses[i] != pC; i++ )
        assert( i < nClauses );
    for (      ; i < nClauses - 1; i++ )
        pClauses[i] = pClauses[i+1];
    Msat_ClauseVecPop( vClauses );
}